

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::ImageLayoutBindingCase::binding_mixed_order
          (LayoutBindingTestResult *__return_storage_ptr__,ImageLayoutBindingCase *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  String local_580;
  String local_560;
  LayoutBindingProgramAutoPtr local_540;
  LayoutBindingProgramAutoPtr program_1;
  String local_518;
  allocator<char> local_4f1;
  string local_4f0 [32];
  string local_4d0 [32];
  String local_4b0;
  string local_490 [32];
  String local_470;
  allocator<char> local_449;
  String local_448;
  allocator<char> local_421;
  String local_420;
  allocator<char> local_3f9;
  String local_3f8;
  undefined1 local_3d8 [8];
  String decl_1;
  String local_3b0;
  LayoutBindingProgramAutoPtr local_390;
  LayoutBindingProgramAutoPtr program;
  String local_368;
  allocator<char> local_341;
  string local_340 [32];
  string local_320 [32];
  String local_300;
  string local_2e0 [32];
  String local_2c0;
  allocator<char> local_299;
  String local_298;
  allocator<char> local_271;
  String local_270;
  allocator<char> local_249;
  String local_248;
  undefined1 local_228 [8];
  String decl;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [8];
  StringStream s;
  bool passed;
  ImageLayoutBindingCase *this_local;
  
  s.super_ostringstream._375_1_ = 1;
  StringStream::StringStream((StringStream *)local_198);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_1d8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_1b8,this,local_1d8);
  poVar4 = std::operator<<((ostream *)local_198,local_1b8);
  std::operator<<(poVar4,";\n");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)((long)&decl.field_2 + 8)
            );
  std::__cxx11::string::~string((string *)(decl.field_2._M_local_buf + 8));
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])();
  pcVar1 = *(char **)CONCAT44(extraout_var,iVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar1,&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"layout(binding=0, rgba8) readonly",&local_271);
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])();
  pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar1,&local_299);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_2e0,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1c])(&local_2c0,this,local_2e0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_320,this,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"float",&local_341);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1d])(&local_300,this,local_320,local_340);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_368,this,0);
  std::__cxx11::string::string((string *)&program);
  LayoutBindingBaseCase::buildUniformDecl
            ((String *)local_228,&this->super_LayoutBindingBaseCase,&local_248,&local_270,&local_298
             ,&local_2c0,&local_300,&local_368,(String *)&program);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)local_228);
  LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
            (&local_390,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
  pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_390);
  bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar5);
  bVar2 = (s.super_ostringstream._375_1_ & 1 & bVar2) != 0;
  s.super_ostringstream._375_1_ = bVar2;
  if (!bVar2) {
    pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_390);
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3b0,pLVar5,false);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar2,&local_3b0,false);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  decl_1.field_2._13_3_ = 0;
  decl_1.field_2._M_local_buf[0xc] = !bVar2;
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_390);
  std::__cxx11::string::~string((string *)local_228);
  StringStream::~StringStream((StringStream *)local_198);
  if (decl_1.field_2._12_4_ == 0) {
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])();
    pcVar1 = *(char **)CONCAT44(extraout_var_01,iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,pcVar1,&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"layout(r32f, binding=0) readonly",&local_421);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])();
    pcVar1 = *(char **)(CONCAT44(extraout_var_02,iVar3) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,pcVar1,&local_449);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_490,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1c])(&local_470,this,local_490);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_4d0,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4f0,"float",&local_4f1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1d])(&local_4b0,this,local_4d0,local_4f0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_518,this,0);
    std::__cxx11::string::string((string *)&program_1);
    LayoutBindingBaseCase::buildUniformDecl
              ((String *)local_3d8,&this->super_LayoutBindingBaseCase,&local_3f8,&local_420,
               &local_448,&local_470,&local_4b0,&local_518,(String *)&program_1);
    std::__cxx11::string::~string((string *)&program_1);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string(local_490);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)local_3d8);
    LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_540,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
    pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_540);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar5);
    bVar2 = (s.super_ostringstream._375_1_ & 1 & bVar2) != 0;
    s.super_ostringstream._375_1_ = bVar2;
    if (!bVar2) {
      pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_540);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_560,pLVar5,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,&local_560,false);
      std::__cxx11::string::~string((string *)&local_560);
    }
    decl_1.field_2._13_3_ = 0;
    decl_1.field_2._M_local_buf[0xc] = !bVar2;
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_540);
    std::__cxx11::string::~string((string *)local_3d8);
    if (decl_1.field_2._12_4_ == 0) {
      std::__cxx11::string::string((string *)&local_580);
      LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_580,false)
      ;
      std::__cxx11::string::~string((string *)&local_580);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_mixed_order(void)
	{
		bool passed = true;

		{
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(binding=0, rgba8) readonly"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}
		{
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(r32f, binding=0) readonly"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}

		return true;
	}